

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::Block2LevelUnsizedStructArrayCase::init
          (Block2LevelUnsizedStructArrayCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_> *this_00;
  ShaderInterface *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  deUint32 dVar3;
  StructType *this_02;
  BufferBlock *this_03;
  long lVar4;
  Random rnd;
  VarType VStack_b8;
  BufferVar local_a0;
  VarType local_60;
  VarType local_48;
  
  this_01 = &(this->super_SSBOLayoutCase).m_interface;
  this_02 = bb::ShaderInterface::allocStruct(this_01,"S");
  glu::VarType::VarType((VarType *)&local_a0,TYPE_INT_VEC3,PRECISION_HIGHP);
  glu::StructType::addMember(this_02,"a",(VarType *)&local_a0);
  glu::VarType::~VarType((VarType *)&local_a0);
  glu::VarType::VarType((VarType *)&local_a0,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember(this_02,"c",(VarType *)&local_a0);
  glu::VarType::~VarType((VarType *)&local_a0);
  this_03 = bb::ShaderInterface::allocBlock(this_01,"Block");
  glu::VarType::VarType(&VStack_b8,TYPE_UINT,PRECISION_LOWP);
  bb::BufferVar::BufferVar(&local_a0,"u",&VStack_b8,0);
  this_00 = &this_03->m_variables;
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (this_00,&local_a0);
  glu::VarType::~VarType(&local_a0.m_type);
  paVar1 = &local_a0.m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.m_name._M_dataplus._M_p,
                    local_a0.m_name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&VStack_b8);
  glu::VarType::VarType(&VStack_b8,TYPE_FLOAT_VEC4,PRECISION_MEDIUMP);
  bb::BufferVar::BufferVar(&local_a0,"v",&VStack_b8,0x1000);
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (this_00,&local_a0);
  glu::VarType::~VarType(&local_a0.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.m_name._M_dataplus._M_p,
                    local_a0.m_name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&VStack_b8);
  glu::VarType::VarType(&local_48,this_02);
  glu::VarType::VarType(&local_60,&local_48,2);
  glu::VarType::VarType(&VStack_b8,&local_60,-1);
  bb::BufferVar::BufferVar(&local_a0,"s",&VStack_b8,0x1800);
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (this_00,&local_a0);
  glu::VarType::~VarType(&local_a0.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.m_name._M_dataplus._M_p,
                    local_a0.m_name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&VStack_b8);
  glu::VarType::~VarType(&local_60);
  glu::VarType::~VarType(&local_48);
  this_03->m_flags = this->m_layoutFlags;
  if (0 < this->m_numInstances) {
    std::__cxx11::string::_M_replace
              ((ulong)&this_03->m_instanceName,0,(char *)(this_03->m_instanceName)._M_string_length,
               0x1c86f6e);
    bb::BufferBlock::setArraySize(this_03,this->m_numInstances);
  }
  deRandom_init((deRandom *)&local_a0,0x928);
  iVar2 = this->m_numInstances + (uint)(this->m_numInstances == 0);
  if (0 < iVar2) {
    lVar4 = 0;
    do {
      dVar3 = deRandom_getUint32((deRandom *)&local_a0);
      (this_03->m_lastUnsizedArraySizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar4] = dVar3 % 5 + 1;
      lVar4 = lVar4 + 1;
      iVar2 = this->m_numInstances + (uint)(this->m_numInstances == 0);
    } while (lVar4 < iVar2);
  }
  return iVar2;
}

Assistant:

void init (void)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, glu::PRECISION_HIGHP));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP));

		BufferBlock& block = m_interface.allocBlock("Block");
		block.addMember(BufferVar("u", VarType(glu::TYPE_UINT, glu::PRECISION_LOWP), 0 /* no access */));
		block.addMember(BufferVar("v", VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_MEDIUMP), ACCESS_WRITE));
		block.addMember(BufferVar("s", VarType(VarType(VarType(&typeS), 2), VarType::UNSIZED_ARRAY), ACCESS_READ|ACCESS_WRITE));
		block.setFlags(m_layoutFlags);

		if (m_numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(m_numInstances);
		}

		{
			de::Random rnd(2344);
			for (int ndx = 0; ndx < (m_numInstances ? m_numInstances : 1); ndx++)
			{
				const int lastArrayLen = rnd.getInt(1, 5);
				block.setLastUnsizedArraySize(ndx, lastArrayLen);
			}
		}
	}